

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O0

UINT8 SndEmu_GetDeviceFunc
                (DEV_DEF *devDef,UINT8 funcType,UINT8 rwType,UINT16 user,void **retFuncPtr)

{
  DEVDEF_RWFUNC *pDVar1;
  int local_40;
  uint local_3c;
  UINT32 foundFunc;
  UINT32 firstFunc;
  DEVDEF_RWFUNC *tempFnc;
  UINT32 curFunc;
  void **retFuncPtr_local;
  UINT16 user_local;
  UINT8 rwType_local;
  UINT8 funcType_local;
  DEV_DEF *devDef_local;
  
  local_40 = 0;
  local_3c = 0;
  tempFnc._4_4_ = 0;
  while (devDef->rwFuncs[tempFnc._4_4_].funcPtr != (void *)0x0) {
    pDVar1 = devDef->rwFuncs + tempFnc._4_4_;
    if (((pDVar1->funcType == funcType) && (pDVar1->rwType == rwType)) &&
       ((user == 0 || (user == pDVar1->user)))) {
      if (local_40 == 0) {
        local_3c = tempFnc._4_4_;
      }
      local_40 = local_40 + 1;
    }
    tempFnc._4_4_ = tempFnc._4_4_ + 1;
  }
  if (local_40 == 0) {
    devDef_local._7_1_ = 0xf8;
  }
  else {
    *retFuncPtr = devDef->rwFuncs[local_3c].funcPtr;
    if (local_40 == 1) {
      devDef_local._7_1_ = '\0';
    }
    else {
      devDef_local._7_1_ = '\x01';
    }
  }
  return devDef_local._7_1_;
}

Assistant:

UINT8 SndEmu_GetDeviceFunc(const DEV_DEF* devDef, UINT8 funcType, UINT8 rwType, UINT16 user, void** retFuncPtr)
{
	UINT32 curFunc;
	const DEVDEF_RWFUNC* tempFnc;
	UINT32 firstFunc;
	UINT32 foundFunc;
	
	foundFunc = 0;
	firstFunc = 0;
	for (curFunc = 0; devDef->rwFuncs[curFunc].funcPtr != NULL; curFunc ++)
	{
		tempFnc = &devDef->rwFuncs[curFunc];
		if (tempFnc->funcType == funcType && tempFnc->rwType == rwType)
		{
			if (! user || user == tempFnc->user)
			{
				if (foundFunc == 0)
					firstFunc = curFunc;
				foundFunc ++;
			}
		}
	}
	if (foundFunc == 0)
		return EERR_NOT_FOUND;
	*retFuncPtr = devDef->rwFuncs[firstFunc].funcPtr;
	if (foundFunc == 1)
		return EERR_OK;
	else
		return EERR_MORE_FOUND;	// found multiple matching functions
}